

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

Test * SubprocessTestInterruptParentWithSigHup::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x2c0);
  SubprocessTestInterruptParentWithSigHup((SubprocessTestInterruptParentWithSigHup *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(SubprocessTest, InterruptParentWithSigHup) {
  Subprocess* subproc = subprocs_.Add("kill -HUP $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork();
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}